

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

string __thiscall mjs::to_string(mjs *this,gc_heap *h,value *v)

{
  value *h_00;
  bool bVar1;
  value_type vVar2;
  string *psVar3;
  wostream *os;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  char *__str;
  double m;
  string sVar5;
  wstring local_230 [32];
  wstring_view local_210;
  wostringstream local_200 [8];
  wostringstream _woss;
  value local_78;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  value *local_20;
  value *v_local;
  gc_heap *h_local;
  undefined8 uVar4;
  
  local_20 = v;
  v_local = (value *)h;
  h_local = (gc_heap *)this;
  vVar2 = value::type(v);
  h_00 = v_local;
  switch(vVar2) {
  case undefined:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"undefined");
    string::string((string *)this,(gc_heap *)h_00,&local_30);
    uVar4 = extraout_RDX;
    break;
  case null:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"null");
    string::string((string *)this,(gc_heap *)h_00,&local_40);
    uVar4 = extraout_RDX_00;
    break;
  case boolean:
    bVar1 = value::boolean_value(local_20);
    __str = "false";
    if (bVar1) {
      __str = "true";
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,__str);
    string::string((string *)this,(gc_heap *)h_00,&local_50);
    uVar4 = extraout_RDX_01;
    break;
  case number:
    m = value::number_value(local_20);
    sVar5 = to_string(this,(gc_heap *)h_00,m);
    uVar4 = sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_;
    break;
  case string:
    psVar3 = value::string_value(local_20);
    string::string((string *)this,psVar3);
    uVar4 = extraout_RDX_02;
    break;
  case object:
    to_primitive(&local_78,local_20,string);
    to_string(this,(gc_heap *)h_00,&local_78);
    value::~value(&local_78);
    uVar4 = extraout_RDX_03;
    break;
  case reference:
  default:
    std::__cxx11::wostringstream::wostringstream(local_200);
    os = std::operator<<((wostream *)local_200,"Not implemented: ");
    vVar2 = value::type(local_20);
    operator<<(os,vVar2);
    std::__cxx11::wostringstream::str();
    local_210 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_230);
    throw_runtime_error(&local_210,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0xe6);
  }
  sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar4;
  sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string to_string(gc_heap& h, const value& v) {
    switch (v.type()) {
    case value_type::undefined: return string{h, "undefined"};
    case value_type::null:      return string{h, "null"};
    case value_type::boolean:   return string{h, v.boolean_value() ? "true" : "false"};
    case value_type::number:    return to_string(h, v.number_value());
    case value_type::string:    return v.string_value();
    case value_type::object:    return to_string(h, to_primitive(v, value_type::string));
    case value_type::reference: break;
    }
    NOT_IMPLEMENTED(v.type());
}